

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFS.hpp
# Opt level: O0

int __thiscall
webfront::fs::detail::NativeRawFS::open(NativeRawFS *this,char *__file,int __oflag,...)

{
  byte bVar1;
  ifstream file;
  undefined7 in_stack_fffffffffffff918;
  int iVar2;
  path *__s;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  path *in_stack_fffffffffffff948;
  ifstream local_220 [520];
  ifstream *local_18;
  char *local_10;
  NativeRawFS *local_8;
  
  __s = &this->rootPath;
  local_18 = ___oflag;
  local_10 = __file;
  local_8 = this;
  std::ifstream::ifstream(local_220);
  std::filesystem::__cxx11::operator/
            (in_stack_fffffffffffff948,
             (path *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)__file,__s,
             (openmode)((ulong)this >> 0x20));
  iVar2 = (int)__s;
  http::std::filesystem::__cxx11::path::~path((path *)this);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    http::std::optional<webfront::fs::File>::optional((optional<webfront::fs::File> *)0x1bf286);
  }
  else {
    std::ifstream::ifstream(&stack0xfffffffffffff948,local_220);
    File::File((File *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),___oflag);
    http::std::optional<webfront::fs::File>::optional<webfront::fs::File,_true>
              ((optional<webfront::fs::File> *)this,
               (File *)CONCAT17(bVar1,in_stack_fffffffffffff918));
    File::~File((File *)this);
    std::ifstream::~ifstream(&stack0xfffffffffffff948);
  }
  std::ifstream::~ifstream(local_220);
  return iVar2;
}

Assistant:

std::optional<File> open(std::filesystem::path path) {
        std::ifstream file;
        file.open(rootPath / path, std::ios::binary);
        if (file.is_open()) return File{std::move(file)};
        return {};
    }